

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::
VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>
::
Combine<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
          (VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>
           *this,ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *source,
          ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *target,AggregateInputData *param_3)

{
  VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>
  VVar1;
  bool bVar2;
  string_t new_value;
  string_t new_value_00;
  
  if ((*this == (VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>
                 )0x1) &&
     (((source->super_ArgMinMaxStateBase).is_initialized != true ||
      (bVar2 = string_t::StringComparisonOperators::GreaterThan
                         (&source->value,(string_t *)(this + 0x18)), bVar2)))) {
    new_value.value.pointer.ptr = (char *)param_3;
    new_value.value._0_8_ = *(undefined8 *)(this + 0x20);
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)&source->value,*(string_t **)(this + 0x18),new_value);
    VVar1 = this[1];
    (source->super_ArgMinMaxStateBase).arg_null = (bool)VVar1;
    if (VVar1 == (VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>
                  )0x0) {
      new_value_00.value.pointer.ptr = (char *)param_3;
      new_value_00.value._0_8_ = *(undefined8 *)(this + 0x10);
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)&source->arg,*(string_t **)(this + 8),new_value_00);
    }
    (source->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			STATE::template AssignValue<typename STATE::BY_TYPE>(target.value, source.value);
			target.arg_null = source.arg_null;
			if (!target.arg_null) {
				STATE::template AssignValue<typename STATE::ARG_TYPE>(target.arg, source.arg);
			}
			target.is_initialized = true;
		}
	}